

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O1

Bbr2Mode __thiscall
quic::Bbr2ProbeBwMode::OnCongestionEvent
          (Bbr2ProbeBwMode *this,QuicByteCount prior_in_flight,QuicTime event_time,
          AckedPacketVector *param_3,LostPacketVector *param_4,Bbr2CongestionEvent *congestion_event
          )

{
  QuicRoundTripCount *pQVar1;
  uint64_t *puVar2;
  CyclePhase CVar3;
  Bbr2NetworkModel *pBVar4;
  bool bVar5;
  long lVar6;
  
  if (congestion_event->end_of_round_trip == true) {
    if ((this->cycle_).cycle_start_time.time_ != event_time.time_) {
      pQVar1 = &(this->cycle_).rounds_since_probe;
      *pQVar1 = *pQVar1 + 1;
    }
    if ((this->cycle_).phase_start_time.time_ != event_time.time_) {
      puVar2 = &(this->cycle_).rounds_in_phase;
      *puVar2 = *puVar2 + 1;
    }
  }
  switch((this->cycle_).phase) {
  case PROBE_UP:
    UpdateProbeUp(this,prior_in_flight,congestion_event);
    break;
  case PROBE_DOWN:
    UpdateProbeDown(this,prior_in_flight,congestion_event);
    if (((this->cycle_).phase != PROBE_DOWN) &&
       (bVar5 = Bbr2NetworkModel::MaybeExpireMinRtt
                          ((this->super_Bbr2ModeBase).model_,congestion_event), bVar5)) {
      return PROBE_RTT;
    }
    break;
  case PROBE_CRUISE:
    UpdateProbeCruise(this,congestion_event);
    break;
  case PROBE_REFILL:
    UpdateProbeRefill(this,congestion_event);
  }
  pBVar4 = (this->super_Bbr2ModeBase).model_;
  CVar3 = (this->cycle_).phase;
  lVar6 = 0x7c;
  if (CVar3 != PROBE_UP) {
    lVar6 = (ulong)(CVar3 != PROBE_DOWN) * 4 + 0x80;
  }
  pBVar4->pacing_gain_ =
       *(float *)((long)&(((this->super_Bbr2ModeBase).sender_)->super_SendAlgorithmInterface).
                         _vptr_SendAlgorithmInterface + lVar6);
  pBVar4->cwnd_gain_ = (((this->super_Bbr2ModeBase).sender_)->params_).probe_bw_cwnd_gain;
  return PROBE_BW;
}

Assistant:

Bbr2Mode Bbr2ProbeBwMode::OnCongestionEvent(
    QuicByteCount prior_in_flight,
    QuicTime event_time,
    const AckedPacketVector& /*acked_packets*/,
    const LostPacketVector& /*lost_packets*/,
    const Bbr2CongestionEvent& congestion_event) {
  //DCHECK_NE(cycle_.phase, CyclePhase::PROBE_NOT_STARTED);

  if (congestion_event.end_of_round_trip) {
    if (cycle_.cycle_start_time != event_time) {
      ++cycle_.rounds_since_probe;
    }
    if (cycle_.phase_start_time != event_time) {
      ++cycle_.rounds_in_phase;
    }
  }

  bool switch_to_probe_rtt = false;

  if (cycle_.phase == CyclePhase::PROBE_UP) {
    UpdateProbeUp(prior_in_flight, congestion_event);
  } else if (cycle_.phase == CyclePhase::PROBE_DOWN) {
    UpdateProbeDown(prior_in_flight, congestion_event);
    // Maybe transition to PROBE_RTT at the end of this cycle.
    if (cycle_.phase != CyclePhase::PROBE_DOWN &&
        model_->MaybeExpireMinRtt(congestion_event)) {
      switch_to_probe_rtt = true;
    }
  } else if (cycle_.phase == CyclePhase::PROBE_CRUISE) {
    UpdateProbeCruise(congestion_event);
  } else if (cycle_.phase == CyclePhase::PROBE_REFILL) {
    UpdateProbeRefill(congestion_event);
  }

  // Do not need to set the gains if switching to PROBE_RTT, they will be set
  // when Bbr2ProbeRttMode::Enter is called.
  if (!switch_to_probe_rtt) {
    model_->set_pacing_gain(PacingGainForPhase(cycle_.phase));
    model_->set_cwnd_gain(Params().probe_bw_cwnd_gain);
  }

  return switch_to_probe_rtt ? Bbr2Mode::PROBE_RTT : Bbr2Mode::PROBE_BW;
}